

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int accum_state_var(vector_t ***var,vector_t ***mean,float32 ***dnom,vector_t **feat,uint32 n_feat,
                   uint32 *veclen,uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint uVar1;
  float32 **ppfVar2;
  vector_t pfVar3;
  vector_t pfVar4;
  vector_t pfVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  
  if (n_frame != 0) {
    uVar10 = 0;
    do {
      uVar8 = 0;
      uVar9 = 0;
      if (ci_sseq != (uint32 *)0x0 && sseq != (uint32 *)0x0) {
        uVar8 = sseq[uVar10];
        uVar9 = ci_sseq[uVar10];
      }
      if (n_feat != 0) {
        ppfVar2 = dnom[uVar8];
        uVar7 = 0;
        do {
          *ppfVar2[uVar7] = (float32)((float)*ppfVar2[uVar7] + 1.0);
          if (uVar8 != uVar9) {
            *dnom[uVar9][uVar7] = (float32)((float)*dnom[uVar9][uVar7] + 1.0);
          }
          uVar1 = veclen[uVar7];
          if ((ulong)uVar1 != 0) {
            pfVar3 = feat[uVar10][uVar7];
            pfVar4 = *mean[uVar8][uVar7];
            pfVar5 = *var[uVar8][uVar7];
            uVar6 = 0;
            do {
              fVar11 = pfVar3[uVar6] - pfVar4[uVar6];
              pfVar5[uVar6] = fVar11 * fVar11 + pfVar5[uVar6];
              if (uVar8 != uVar9) {
                fVar11 = pfVar3[uVar6] - (*mean[uVar9][uVar7])[uVar6];
                (*var[uVar9][uVar7])[uVar6] = fVar11 * fVar11 + (*var[uVar9][uVar7])[uVar6];
              }
              uVar6 = uVar6 + 1;
            } while (uVar1 != uVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != n_feat);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != n_frame);
  }
  return 0;
}

Assistant:

int
accum_state_var(vector_t ***var,
		vector_t ***mean,
		float32  ***dnom,
		vector_t **feat,
		uint32 n_feat,
		const uint32 *veclen,
		uint32 *sseq,
		uint32 *ci_sseq,
		uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */
    float32 diff;

    for (t = 0; t < n_frame; t++) {

	if (sseq && ci_sseq) {
	    /* get the tied state for time t */
	    s = sseq[t];
	
	    /* get the CI state as well */
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++) {
		/* only one Gaussian per state */

		diff = feat[t][f][c] - mean[s][f][0][c];
		var[s][f][0][c] += diff * diff;

		if (s != ci_s) {
		    diff = feat[t][f][c] - mean[ci_s][f][0][c];
		    var[ci_s][f][0][c] += diff * diff;
		}
	    }
	}
    }
    return 0;
}